

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

void __thiscall ElfFile::writeHeader(ElfFile *this,ByteArray *data,size_t pos,Endianness endianness)

{
  ushort uVar1;
  byte *pbVar2;
  undefined8 uVar3;
  
  pbVar2 = (this->fileData).data_;
  uVar3 = *(undefined8 *)((this->fileHeader).e_ident + 8);
  *(undefined8 *)pbVar2 = *(undefined8 *)(this->fileHeader).e_ident;
  *(undefined8 *)(pbVar2 + 8) = uVar3;
  if (pos + 0x11 < data->size_) {
    uVar1 = (this->fileHeader).e_type;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x10] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x10] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x11] = (byte)uVar1;
  }
  if (pos + 0x13 < data->size_) {
    uVar1 = (this->fileHeader).e_machine;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x12] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x12] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x13] = (byte)uVar1;
  }
  ByteArray::replaceDoubleWord(data,pos + 0x14,(this->fileHeader).e_version,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x18,(this->fileHeader).e_entry,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x1c,(this->fileHeader).e_phoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x20,(this->fileHeader).e_shoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x24,(this->fileHeader).e_flags,endianness);
  if (pos + 0x29 < data->size_) {
    uVar1 = (this->fileHeader).e_ehsize;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x28] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x28] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x29] = (byte)uVar1;
  }
  if (pos + 0x2b < data->size_) {
    uVar1 = (this->fileHeader).e_phentsize;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x2a] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x2a] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x2b] = (byte)uVar1;
  }
  if (pos + 0x2d < data->size_) {
    uVar1 = (this->fileHeader).e_phnum;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x2c] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x2c] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x2d] = (byte)uVar1;
  }
  if (pos + 0x2f < data->size_) {
    uVar1 = (this->fileHeader).e_shentsize;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x2e] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x2e] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x2f] = (byte)uVar1;
  }
  if (pos + 0x31 < data->size_) {
    uVar1 = (this->fileHeader).e_shnum;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x30] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x30] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x31] = (byte)uVar1;
  }
  if (pos + 0x33 < data->size_) {
    uVar1 = (this->fileHeader).e_shstrndx;
    pbVar2 = data->data_;
    if (endianness == Little) {
      pbVar2[pos + 0x32] = (byte)uVar1;
      uVar1 = uVar1 >> 8;
    }
    else {
      pbVar2[pos + 0x32] = (byte)(uVar1 >> 8);
    }
    pbVar2[pos + 0x33] = (byte)uVar1;
  }
  return;
}

Assistant:

void ElfFile::writeHeader(ByteArray& data, size_t pos, Endianness endianness)
{
	memcpy(&fileData[0], fileHeader.e_ident, sizeof(fileHeader.e_ident));
	data.replaceWord(pos + 0x10, fileHeader.e_type, endianness);
	data.replaceWord(pos + 0x12, fileHeader.e_machine, endianness);
	data.replaceDoubleWord(pos + 0x14, fileHeader.e_version, endianness);
	data.replaceDoubleWord(pos + 0x18, fileHeader.e_entry, endianness);
	data.replaceDoubleWord(pos + 0x1C, fileHeader.e_phoff, endianness);
	data.replaceDoubleWord(pos + 0x20, fileHeader.e_shoff, endianness);
	data.replaceDoubleWord(pos + 0x24, fileHeader.e_flags, endianness);
	data.replaceWord(pos + 0x28, fileHeader.e_ehsize, endianness);
	data.replaceWord(pos + 0x2A, fileHeader.e_phentsize, endianness);
	data.replaceWord(pos + 0x2C, fileHeader.e_phnum, endianness);
	data.replaceWord(pos + 0x2E, fileHeader.e_shentsize, endianness);
	data.replaceWord(pos + 0x30, fileHeader.e_shnum, endianness);
	data.replaceWord(pos + 0x32, fileHeader.e_shstrndx, endianness);
}